

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_util_tests.hpp
# Opt level: O0

string * __thiscall
iuutil::TestSuiteNameRemoveInstantiateAndIndexName_abi_cxx11_
          (string *__return_storage_ptr__,iuutil *this,char *name)

{
  char *__beg;
  char *__end;
  char *name_00;
  char *name_01;
  string local_88;
  allocator<char> local_61;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  allocator<char> local_29;
  char *local_28;
  char *p1;
  char *pkg;
  char *name_local;
  
  pkg = (char *)this;
  name_local = (char *)__return_storage_ptr__;
  p1 = strrchr((char *)this,0x2e);
  local_28 = strchr(pkg,0x2f);
  __beg = pkg;
  if (local_28 == (char *)0x0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,__beg,&local_29);
    std::allocator<char>::~allocator(&local_29);
  }
  else if (p1 == (char *)0x0) {
    TestSuiteNameRemoveIndexName_abi_cxx11_(__return_storage_ptr__,(iuutil *)(local_28 + 1),name_00)
    ;
  }
  else {
    __end = p1 + 1;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<char_const*,void>((string *)&local_60,__beg,__end,&local_61);
    TestSuiteNameRemoveIndexName_abi_cxx11_(&local_88,(iuutil *)(local_28 + 1),name_01);
    std::operator+(__return_storage_ptr__,&local_60,&local_88);
    std::__cxx11::string::~string((string *)&local_88);
    std::__cxx11::string::~string((string *)&local_60);
    std::allocator<char>::~allocator(&local_61);
  }
  return __return_storage_ptr__;
}

Assistant:

inline ::std::string TestSuiteNameRemoveInstantiateAndIndexName(const char* name)
{
    // パッケージ名があれば取得
    const char* const pkg = strrchr(name, '.');
    // 先頭にインスタンス名がある
    const char* const p1 = strchr(name, '/');
    if( p1 == NULL )
    {
        return name;
    }
    if( pkg == NULL )
    {
        return TestSuiteNameRemoveIndexName(p1 + 1);
    }
    else
    {
        return ::std::string(name, pkg + 1) + TestSuiteNameRemoveIndexName(p1 + 1);
    }
}